

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O0

wchar_t borg_best_mult(borg_item *obj,monster_race *r_ptr)

{
  slay_conflict *psVar1;
  brand_conflict *pbVar2;
  _Bool _Var3;
  wchar_t local_40;
  wchar_t local_3c;
  slay *slay;
  wchar_t mult;
  brand *brand;
  wchar_t max_mult;
  wchar_t i;
  monster_race *r_ptr_local;
  borg_item *obj_local;
  
  brand._0_4_ = L'\x01';
  for (brand._4_4_ = L'\x01'; pbVar2 = brands, brand._4_4_ < (int)(uint)z_info->brand_max;
      brand._4_4_ = brand._4_4_ + L'\x01') {
    if ((obj == (borg_item *)0x0) || (obj->iqty == '\0')) {
      _Var3 = player_has_temporary_brand(player,brand._4_4_);
      if (_Var3) goto LAB_00289aaa;
    }
    else if ((obj->brands[brand._4_4_] & 1U) != 0) {
LAB_00289aaa:
      _Var3 = flag_has_dbg(r_ptr->flags,0xb,pbVar2[brand._4_4_].resist_flag,"r_ptr->flags",
                           "brand->resist_flag");
      if (!_Var3) {
        slay._4_4_ = pbVar2[brand._4_4_].multiplier;
        if ((pbVar2[brand._4_4_].vuln_flag != 0) &&
           (_Var3 = flag_has_dbg(r_ptr->flags,0xb,pbVar2[brand._4_4_].vuln_flag,"r_ptr->flags",
                                 "brand->vuln_flag"), _Var3)) {
          slay._4_4_ = slay._4_4_ << 1;
        }
        if (slay._4_4_ < (wchar_t)brand) {
          local_3c = (wchar_t)brand;
        }
        else {
          local_3c = slay._4_4_;
        }
        brand._0_4_ = local_3c;
      }
    }
  }
  brand._4_4_ = L'\x01';
  do {
    psVar1 = slays;
    if ((int)(uint)z_info->slay_max <= brand._4_4_) {
      return (wchar_t)brand;
    }
    if ((obj == (borg_item *)0x0) || (obj->iqty == '\0')) {
      _Var3 = player_has_temporary_slay(player,brand._4_4_);
      if (_Var3) goto LAB_00289bc7;
    }
    else if (obj->slays[brand._4_4_] != L'\0') {
LAB_00289bc7:
      _Var3 = flag_has_dbg(r_ptr->flags,0xb,psVar1[brand._4_4_].race_flag,"r_ptr->flags",
                           "slay->race_flag");
      if (_Var3) {
        if (psVar1[brand._4_4_].multiplier < (wchar_t)brand) {
          local_40 = (wchar_t)brand;
        }
        else {
          local_40 = psVar1[brand._4_4_].multiplier;
        }
        brand._0_4_ = local_40;
      }
    }
    brand._4_4_ = brand._4_4_ + L'\x01';
  } while( true );
}

Assistant:

static int borg_best_mult(borg_item *obj, struct monster_race *r_ptr)
{
    int i;
    int max_mult = 1;

    /* Brands */
    for (i = 1; i < z_info->brand_max; i++) {
        struct brand *brand = &brands[i];
        if (obj && obj->iqty) {
            /* Brand is on an object */
            if (!obj->brands[i])
                continue;
        } else {
            /* Temporary brand */
            if (!player_has_temporary_brand(player, i))
                continue;
        }

        /* Is the monster vulnerable? */
        if (!rf_has(r_ptr->flags, brand->resist_flag)) {
            int mult = brand->multiplier;
            if (brand->vuln_flag && rf_has(r_ptr->flags, brand->vuln_flag)) {
                mult *= 2;
            }
            max_mult = MAX(mult, max_mult);
        }
    }

    /* Slays */
    for (i = 1; i < z_info->slay_max; i++) {
        struct slay *slay = &slays[i];
        if (obj && obj->iqty) {
            /* Slay is on an object */
            if (!obj->slays[i])
                continue;
        } else {
            /* Temporary slay */
            if (!player_has_temporary_slay(player, i))
                continue;
        }

        if (rf_has(r_ptr->flags, slay->race_flag)) {
            max_mult = MAX(slay->multiplier, max_mult);
        }
    }
    return max_mult;
}